

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O3

void __thiscall
google::protobuf::internal::UntypedMapBase::DeleteTable
          (UntypedMapBase *this,NodeBase **table,map_index_t n)

{
  long in_FS_OFFSET;
  
  if (this->arena_ == (Arena *)0x0) {
    operator_delete(table,(ulong)n << 3);
    return;
  }
  if (*(uint64_t *)(in_FS_OFFSET + -0x78) == (this->arena_->impl_).tag_and_id_) {
    SerialArena::ReturnArrayMemory(*(SerialArena **)(in_FS_OFFSET + -0x70),table,(ulong)n << 3);
    return;
  }
  return;
}

Assistant:

void InternalSwap(UntypedMapBase* other) {
    std::swap(num_elements_, other->num_elements_);
    std::swap(num_buckets_, other->num_buckets_);
    std::swap(index_of_first_non_null_, other->index_of_first_non_null_);
    std::swap(type_info_, other->type_info_);
    std::swap(table_, other->table_);
    std::swap(arena_, other->arena_);
  }